

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ExpressionLhs<bool>::endExpression(ExpressionLhs<bool> *this)

{
  bool result;
  ResultBuilder *pRVar1;
  bool in_DL;
  string sStack_38;
  
  pRVar1 = this->m_rb;
  result = this->m_lhs;
  Catch::toString_abi_cxx11_(&sStack_38,(Catch *)(ulong)result,in_DL);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&sStack_38);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  ResultBuilder::endExpression(pRVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void endExpression() {
        bool value = m_lhs ? true : false;
        m_rb
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression();
    }